

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void Unserialize<ParamsStream<AutoFile&,TransactionSerParams>,CTransaction>
               (ParamsStream<AutoFile_&,_TransactionSerParams> *is,shared_ptr<const_CTransaction> *p
               )

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  CTransaction *pCVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_FS_OFFSET;
  CTransaction *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  undefined1 local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,deserialize_type_const&,ParamsStream<AutoFile&,TransactionSerParams>&>
            (a_Stack_30,&local_38,(allocator<CTransaction> *)&local_19,
             (deserialize_type *)&deserialize,is);
  _Var2._M_pi = a_Stack_30[0]._M_pi;
  pCVar1 = local_38;
  local_38 = (CTransaction *)0x0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (p->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (p->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pCVar1;
  (p->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       _Var2._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& is, std::shared_ptr<const T>& p)
{
    p = std::make_shared<const T>(deserialize, is);
}